

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkCompleteStep(ARKodeMem ark_mem,sunrealtype dsm)

{
  ARKInterp p_Var1;
  int iVar2;
  ARKodeMem in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  sunrealtype troundoff;
  int retval;
  sunrealtype in_stack_ffffffffffffffc8;
  ARKInterp in_stack_ffffffffffffffd0;
  ARKodeMem_conflict in_stack_ffffffffffffffd8;
  int local_4;
  
  p_Var1 = (ARKInterp)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if (in_RDI->use_compensated_sums == 0) {
    in_RDI->tcur = in_RDI->tn + in_RDI->h;
  }
  else {
    sunCompensatedSum(in_RDI->tn,in_RDI->h,&in_RDI->tcur,&in_RDI->terr);
  }
  if ((in_RDI->tstopset != 0) &&
     (in_stack_ffffffffffffffd8 =
           (ARKodeMem_conflict)(in_RDI->uround * 100.0 * (ABS(in_RDI->tcur) + ABS(in_RDI->h))),
     ABS(in_RDI->tcur - in_RDI->tstop) <= (double)in_stack_ffffffffffffffd8)) {
    in_RDI->tcur = in_RDI->tstop;
  }
  if (in_RDI->AccumErrorType != ARK_ACCUMERROR_NONE) {
    if (in_RDI->AccumErrorType == ARK_ACCUMERROR_MAX) {
      in_stack_ffffffffffffffd0 = p_Var1;
      if ((double)p_Var1 < in_RDI->AccumError || (double)p_Var1 == in_RDI->AccumError) {
        in_stack_ffffffffffffffd0 = (ARKInterp)in_RDI->AccumError;
      }
      in_RDI->AccumError = (sunrealtype)in_stack_ffffffffffffffd0;
    }
    else if (in_RDI->AccumErrorType == ARK_ACCUMERROR_SUM) {
      in_RDI->AccumError = (double)p_Var1 + in_RDI->AccumError;
    }
    else {
      in_RDI->AccumError = (double)p_Var1 * in_RDI->h + in_RDI->AccumError;
    }
  }
  if ((in_RDI->ProcessStep == (ARKPostProcessFn)0x0) ||
     (iVar2 = (*in_RDI->ProcessStep)(in_RDI->tcur,in_RDI->ycur,in_RDI->ps_data), iVar2 == 0)) {
    if ((in_RDI->interp == (ARKInterp)0x0) ||
       (local_4 = arkInterpUpdate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                                  in_stack_ffffffffffffffc8), local_4 == 0)) {
      N_VScale(0,in_RDI->ycur,in_RDI->yn);
      in_RDI->fn_is_current = 0;
      if ((in_RDI->hadapt_mem->hcontroller == (SUNAdaptController)0x0) ||
         (iVar2 = SUNAdaptController_UpdateH
                            (SUB84(in_RDI->h,0),p_Var1,in_RDI->hadapt_mem->hcontroller), iVar2 == 0)
         ) {
        in_RDI->nst = in_RDI->nst + 1;
        in_RDI->checkpoint_step_idx = in_RDI->checkpoint_step_idx + 1;
        in_RDI->hold = in_RDI->h;
        in_RDI->tn = in_RDI->tcur;
        in_RDI->hprime = in_RDI->h * in_RDI->eta;
        in_RDI->hadapt_mem->etamax = in_RDI->hadapt_mem->growth;
        in_RDI->initsetup = 0;
        in_RDI->firststage = 0;
        local_4 = 0;
      }
      else {
        arkProcessError(in_RDI,-0x2f,0xaba,"arkCompleteStep",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                        ,"Failure updating controller object");
        local_4 = -0x2f;
      }
    }
  }
  else {
    local_4 = -0x25;
  }
  return local_4;
}

Assistant:

int arkCompleteStep(ARKodeMem ark_mem, sunrealtype dsm)
{
  int retval;
  sunrealtype troundoff;

  /* Set current time to the end of the step (in case the last
     stage time does not coincide with the step solution time).
     If tstop is enabled, it is possible for tn + h to be past
     tstop by roundoff, and in that case, we reset tn (after
     incrementing by h) to tstop. */

  /* During long-time integration, roundoff can creep into tcur.
     Compensated summation fixes this but with increased cost, so it is optional. */
  if (ark_mem->use_compensated_sums)
  {
    sunCompensatedSum(ark_mem->tn, ark_mem->h, &ark_mem->tcur, &ark_mem->terr);
  }
  else { ark_mem->tcur = ark_mem->tn + ark_mem->h; }

  if (ark_mem->tstopset)
  {
    troundoff = FUZZ_FACTOR * ark_mem->uround *
                (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));
    if (SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff)
    {
      ark_mem->tcur = ark_mem->tstop;
    }
  }

  /* store this step's contribution to accumulated temporal error */
  if (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)
  {
    if (ark_mem->AccumErrorType == ARK_ACCUMERROR_MAX)
    {
      ark_mem->AccumError = SUNMAX(dsm, ark_mem->AccumError);
    }
    else if (ark_mem->AccumErrorType == ARK_ACCUMERROR_SUM)
    {
      ark_mem->AccumError += dsm;
    }
    else /* ARK_ACCUMERROR_AVG */ { ark_mem->AccumError += (dsm * ark_mem->h); }
  }

  /* apply user-supplied step postprocessing function (if supplied) */
  if (ark_mem->ProcessStep != NULL)
  {
    retval = ark_mem->ProcessStep(ark_mem->tcur, ark_mem->ycur, ark_mem->ps_data);
    if (retval != 0) { return (ARK_POSTPROCESS_STEP_FAIL); }
  }

  /* update interpolation structure

     NOTE: This must be called before updating yn with ycur as the interpolation
     module may need to save tn, yn from the start of this step. */
  if (ark_mem->interp != NULL)
  {
    retval = arkInterpUpdate(ark_mem, ark_mem->interp, ark_mem->tcur);
    if (retval != ARK_SUCCESS) { return (retval); }
  }

  /* update yn to current solution */
  N_VScale(ONE, ark_mem->ycur, ark_mem->yn);
  ark_mem->fn_is_current = SUNFALSE;

  /* Notify time step controller object of successful step */
  if (ark_mem->hadapt_mem->hcontroller)
  {
    retval = SUNAdaptController_UpdateH(ark_mem->hadapt_mem->hcontroller,
                                        ark_mem->h, dsm);
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__, __FILE__,
                      "Failure updating controller object");
      return (ARK_CONTROLLER_ERR);
    }
  }

  /* update scalar quantities */
  ark_mem->nst++;
  ark_mem->checkpoint_step_idx++;
  ark_mem->hold   = ark_mem->h;
  ark_mem->tn     = ark_mem->tcur;
  ark_mem->hprime = ark_mem->h * ark_mem->eta;

  /* Reset growth factor for subsequent time step */
  ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->growth;

  /* Turn off flag indicating initial step and first stage */
  ark_mem->initsetup  = SUNFALSE;
  ark_mem->firststage = SUNFALSE;

  return (ARK_SUCCESS);
}